

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cpp
# Opt level: O2

void Liby::Resolver::async_resolve(string *host,string *service,ResolverHandler *handler)

{
  int iVar1;
  EventLoop *loop;
  function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)> fStack_48;
  
  if (async_resolve(std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>const&)
      ::rt == '\0') {
    iVar1 = __cxa_guard_acquire(&async_resolve(std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>const&)
                                 ::rt);
    if (iVar1 != 0) {
      ResolverThread::ResolverThread(&async_resolve::rt);
      __cxa_atexit(ResolverThread::~ResolverThread,&async_resolve::rt,&__dso_handle);
      __cxa_guard_release(&async_resolve(std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>const&)
                           ::rt);
    }
  }
  if (async_resolve(std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>const&)
      ::ri == '\0') {
    iVar1 = __cxa_guard_acquire(&async_resolve(std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>const&)
                                 ::ri);
    if (iVar1 != 0) {
      ResolverImp::ResolverImp(&async_resolve::ri,&async_resolve::rt);
      __cxa_atexit(ResolverImp::~ResolverImp,&async_resolve::ri,&__dso_handle);
      __cxa_guard_release(&async_resolve(std::__cxx11::string_const&,std::__cxx11::string_const&,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>const&)
                           ::ri);
    }
  }
  loop = EventLoop::curr_thread_loop();
  std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>::
  function(&fStack_48,handler);
  ResolverThread::resolve(&async_resolve::rt,host,service,loop,&fStack_48);
  std::_Function_base::~_Function_base(&fStack_48.super__Function_base);
  return;
}

Assistant:

void Resolver::async_resolve(const std::string &host,
                             const std::string &service,
                             const ResolverHandler &handler) {
    static ResolverThread rt;
    static ResolverImp ri(rt);

    EventLoop *loop = EventLoop::curr_thread_loop();
    rt.resolve(host, service, loop, handler);
}